

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_queue.h
# Opt level: O0

bool __thiscall
WorkQueue<CMU462::WorkItem>::try_get_work(WorkQueue<CMU462::WorkItem> *this,WorkItem *outPtr)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  __normal_iterator<CMU462::WorkItem_*,_std::vector<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>_>
  local_30;
  const_iterator local_28;
  WorkItem *local_20;
  WorkItem *outPtr_local;
  WorkQueue<CMU462::WorkItem> *this_local;
  
  local_20 = outPtr;
  outPtr_local = (WorkItem *)this;
  std::mutex::lock(&this->lock);
  bVar2 = std::vector<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>::empty(&this->storage);
  if (bVar2) {
    std::mutex::unlock(&this->lock);
  }
  else {
    pvVar3 = std::vector<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>::front(&this->storage)
    ;
    iVar1 = pvVar3->tile_y;
    local_20->tile_x = pvVar3->tile_x;
    local_20->tile_y = iVar1;
    iVar1 = pvVar3->tile_h;
    local_20->tile_w = pvVar3->tile_w;
    local_20->tile_h = iVar1;
    local_30._M_current =
         (WorkItem *)
         std::vector<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>::begin(&this->storage);
    __gnu_cxx::
    __normal_iterator<CMU462::WorkItem_const*,std::vector<CMU462::WorkItem,std::allocator<CMU462::WorkItem>>>
    ::__normal_iterator<CMU462::WorkItem*>
              ((__normal_iterator<CMU462::WorkItem_const*,std::vector<CMU462::WorkItem,std::allocator<CMU462::WorkItem>>>
                *)&local_28,&local_30);
    std::vector<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>::erase(&this->storage,local_28)
    ;
    std::mutex::unlock(&this->lock);
  }
  this_local._7_1_ = !bVar2;
  return this_local._7_1_;
}

Assistant:

bool try_get_work(T *outPtr) {
      lock.lock();
      if (storage.empty()) {
        lock.unlock();
        return false;
      }
      *outPtr = storage.front();
      storage.erase(storage.begin());
      lock.unlock();
      return true;
    }